

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVerify.cpp
# Opt level: O0

void negation_verify::NegationVerifyT<int>(void)

{
  int t;
  ostream *poVar1;
  int out;
  bool result;
  int test;
  int minInt;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_2c;
  int local_28;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_18;
  int local_14;
  int local_10;
  byte local_9;
  int local_8;
  int local_4;
  
  local_4 = std::numeric_limits<int>::min();
  local_8 = 2;
  local_9 = 0;
  local_10 = 0;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_18,&local_4);
  local_14 = (int)SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  ::operator-(in_stack_ffffffffffffffa8);
  local_10 = SafeInt::operator_cast_to_int
                       ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                         *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if ((local_9 & 1) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error in NegationVerifyT throw (1): ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_2c,&local_8);
  local_28 = (int)SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  ::operator-(in_stack_ffffffffffffffa8);
  t = SafeInt::operator_cast_to_int
                ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_10 = t;
  if ((local_9 & 1) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error in NegationVerifyT throw (2): ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  local_9 = SafeNegation<int>(t,&in_stack_ffffffffffffffa8->m_int);
  if ((bool)local_9) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error in NegationVerifyT nothrow (1): ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  local_9 = SafeNegation<int>(t,&in_stack_ffffffffffffffa8->m_int);
  if (!(bool)local_9) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error in NegationVerifyT nothrow (2): ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void NegationVerifyT()
    {
        T minInt = std::numeric_limits<T>::min();
        T test = 2;
        bool result = false;
        T out = 0;

        try
        {
            out = -SafeInt< T >(minInt);
        }
        catch (...)
        {
            result = true;
        }

        if (result == false)
            std::cerr << "Error in NegationVerifyT throw (1): " << std::endl;

        try
        {
            out = -SafeInt< T >(test);
        }
        catch (...)
        {
            result = false;
        }

        if (result == false)
            std::cerr << "Error in NegationVerifyT throw (2): " << std::endl;

        // Now try the non-throwing version

        result = SafeNegation(minInt, out);

        if (result != false)
            std::cerr << "Error in NegationVerifyT nothrow (1): " << std::endl;

        result = SafeNegation(test, out);

        if (result == false)
            std::cerr << "Error in NegationVerifyT nothrow (2): " << std::endl;
    }